

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

LPWSTR UTIL_MBToWC_Alloc(LPCSTR lpMultiByteStr,int cbMultiByte)

{
  FILE *__stream;
  uint cchWideChar;
  DWORD DVar1;
  int iVar2;
  int *piVar3;
  size_t fullsize;
  LPWSTR lpWideCharStr;
  int length;
  int cbMultiByte_local;
  LPCSTR lpMultiByteStr_local;
  
  cchWideChar = MultiByteToWideChar(0,0,lpMultiByteStr,cbMultiByte,(LPWSTR)0x0,0);
  if (cchWideChar == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    GetLastError();
    lpMultiByteStr_local = (LPCSTR)0x0;
  }
  else if (cchWideChar < 0x3fffffff) {
    lpMultiByteStr_local = (LPCSTR)PAL_malloc((long)(int)cchWideChar << 1);
    if ((LPWSTR)lpMultiByteStr_local == (LPWSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar3 = __errno_location();
      strerror(*piVar3);
      DVar1 = FILEGetLastErrorFromErrno();
      SetLastError(DVar1);
      lpMultiByteStr_local = (LPCSTR)0x0;
    }
    else {
      iVar2 = MultiByteToWideChar(0,0,lpMultiByteStr,cbMultiByte,(LPWSTR)lpMultiByteStr_local,
                                  cchWideChar);
      if (iVar2 < 1) {
        fprintf(_stderr,"] %s %s:%d","UTIL_MBToWC_Alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/utils.cpp"
                ,0x105);
        __stream = _stderr;
        DVar1 = GetLastError();
        fprintf(__stream,"MCToMB error; GetLastError returns %#x\n",(ulong)DVar1);
        PAL_free(lpMultiByteStr_local);
        lpMultiByteStr_local = (LPCSTR)0x0;
      }
    }
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(0x216);
    lpMultiByteStr_local = (LPCSTR)0x0;
  }
  return (LPWSTR)lpMultiByteStr_local;
}

Assistant:

LPWSTR UTIL_MBToWC_Alloc(LPCSTR lpMultiByteStr, int cbMultiByte)
{
    int length;
    LPWSTR lpWideCharStr;

    /* get required buffer length */
    length = MultiByteToWideChar(CP_ACP, 0, lpMultiByteStr, cbMultiByte,
                                      NULL, 0);
    if(0 == length)
    {
        ERROR("MBToWC error; GetLastError returns %#x", GetLastError());
        return NULL;
    }

    if (length >= (INT_MAX / sizeof(WCHAR)))
    {
        ERROR("integer overflow! length = %d , sizeof(WCHAR) = (%d)\n", length,sizeof(WCHAR) );
        SetLastError(ERROR_ARITHMETIC_OVERFLOW);
        return NULL;
    }

    /* allocate required buffer */
    size_t fullsize = length * sizeof(WCHAR);
    lpWideCharStr = (LPWSTR)PAL_malloc(fullsize);
    if(NULL == lpWideCharStr)
    {
        ERROR("malloc() failed! errno is %d (%s)\n", errno,strerror(errno));
        SetLastError(FILEGetLastErrorFromErrno());
        return NULL;
    }

    /* convert into allocated buffer */
    length = MultiByteToWideChar(CP_ACP, 0, lpMultiByteStr, cbMultiByte, 
                                      lpWideCharStr, length);
    if(0 >= length)
    {
        ASSERT("MCToMB error; GetLastError returns %#x\n", GetLastError());
        PAL_free(lpWideCharStr);
        return NULL;
    }
    return lpWideCharStr;
}